

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

void __thiscall llama_vocab::impl::print_info(impl *this)

{
  _Head_base<0UL,_llama_vocab::impl_*,_false> _Var1;
  _Base_ptr p_Var2;
  long lVar3;
  string local_50;
  
  type_name_abi_cxx11_(&local_50,this);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: vocab type       = %s\n","print_info",
                     local_50._M_dataplus._M_p);
  ::std::__cxx11::string::~string((string *)&local_50);
  _Var1._M_head_impl =
       (this->vocab->pimpl)._M_t.
       super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
       super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
       super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl;
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_vocab          = %u\n","print_info",
                     ((long)*(pointer *)((long)&(_Var1._M_head_impl)->id_to_token + 8) -
                     *(long *)&((_Var1._M_head_impl)->id_to_token).
                               super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                     ) / 0x28 & 0xffffffff);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_merges         = %u\n","print_info",
                     (ulong)(uint)(this->bpe_ranks)._M_h._M_element_count);
  lVar3 = (long)this->special_bos_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: BOS token        = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_eos_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: EOS token        = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_eot_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: EOT token        = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_eom_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: EOM token        = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_unk_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: UNK token        = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_sep_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: SEP token        = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_pad_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: PAD token        = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_mask_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: MASK token       = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->linefeed_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: LF token         = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_fim_pre_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: FIM PRE token    = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_fim_suf_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: FIM SUF token    = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_fim_mid_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: FIM MID token    = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_fim_pad_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: FIM PAD token    = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_fim_rep_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: FIM REP token    = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  lVar3 = (long)this->special_fim_sep_id;
  if (lVar3 != -1) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: FIM SEP token    = %d \'%s\'\n","print_info",lVar3,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar3].text._M_dataplus._M_p);
  }
  for (p_Var2 = (this->special_eog_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->special_eog_ids)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2)) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: EOG token        = %d \'%s\'\n","print_info",
                       (long)(int)p_Var2[1]._M_color,
                       (this->id_to_token).
                       super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)p_Var2[1]._M_color].text.
                       _M_dataplus._M_p);
  }
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: max token length = %d\n","print_info",
                     (ulong)(uint)this->max_token_len);
  return;
}

Assistant:

void llama_vocab::impl::print_info() const {
    LLAMA_LOG_INFO("%s: vocab type       = %s\n",     __func__, type_name().c_str());
    LLAMA_LOG_INFO("%s: n_vocab          = %u\n",     __func__, vocab.n_tokens());
    LLAMA_LOG_INFO("%s: n_merges         = %u\n",     __func__, (uint32_t) bpe_ranks.size());

    // special tokens
    if (special_bos_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: BOS token        = %d '%s'\n", __func__, special_bos_id,     id_to_token[special_bos_id].text.c_str() );  }
    if (special_eos_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: EOS token        = %d '%s'\n", __func__, special_eos_id,     id_to_token[special_eos_id].text.c_str() );  }
    if (special_eot_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: EOT token        = %d '%s'\n", __func__, special_eot_id,     id_to_token[special_eot_id].text.c_str() );  }
    if (special_eom_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: EOM token        = %d '%s'\n", __func__, special_eom_id,     id_to_token[special_eom_id].text.c_str() );  }
    if (special_unk_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: UNK token        = %d '%s'\n", __func__, special_unk_id,     id_to_token[special_unk_id].text.c_str() );  }
    if (special_sep_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: SEP token        = %d '%s'\n", __func__, special_sep_id,     id_to_token[special_sep_id].text.c_str() );  }
    if (special_pad_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: PAD token        = %d '%s'\n", __func__, special_pad_id,     id_to_token[special_pad_id].text.c_str() );  }
    if (special_mask_id != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: MASK token       = %d '%s'\n", __func__, special_mask_id,    id_to_token[special_mask_id].text.c_str() ); }

    if (linefeed_id != LLAMA_TOKEN_NULL)        { LLAMA_LOG_INFO( "%s: LF token         = %d '%s'\n", __func__, linefeed_id,        id_to_token[linefeed_id].text.c_str() ); }

    if (special_fim_pre_id != LLAMA_TOKEN_NULL) { LLAMA_LOG_INFO( "%s: FIM PRE token    = %d '%s'\n", __func__, special_fim_pre_id, id_to_token[special_fim_pre_id].text.c_str() ); }
    if (special_fim_suf_id != LLAMA_TOKEN_NULL) { LLAMA_LOG_INFO( "%s: FIM SUF token    = %d '%s'\n", __func__, special_fim_suf_id, id_to_token[special_fim_suf_id].text.c_str() ); }
    if (special_fim_mid_id != LLAMA_TOKEN_NULL) { LLAMA_LOG_INFO( "%s: FIM MID token    = %d '%s'\n", __func__, special_fim_mid_id, id_to_token[special_fim_mid_id].text.c_str() ); }
    if (special_fim_pad_id != LLAMA_TOKEN_NULL) { LLAMA_LOG_INFO( "%s: FIM PAD token    = %d '%s'\n", __func__, special_fim_pad_id, id_to_token[special_fim_pad_id].text.c_str() ); }
    if (special_fim_rep_id != LLAMA_TOKEN_NULL) { LLAMA_LOG_INFO( "%s: FIM REP token    = %d '%s'\n", __func__, special_fim_rep_id, id_to_token[special_fim_rep_id].text.c_str() ); }
    if (special_fim_sep_id != LLAMA_TOKEN_NULL) { LLAMA_LOG_INFO( "%s: FIM SEP token    = %d '%s'\n", __func__, special_fim_sep_id, id_to_token[special_fim_sep_id].text.c_str() ); }

    for (const auto & id : special_eog_ids) {
        LLAMA_LOG_INFO( "%s: EOG token        = %d '%s'\n", __func__, id, id_to_token[id].text.c_str() );
    }

    LLAMA_LOG_INFO("%s: max token length = %d\n", __func__, max_token_len);
}